

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::ParseScriptFunctionScopeInfo
               (ScriptFunctionScopeInfo *funcScopeInfo,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  TTD_PTR_ID TVar3;
  TTD_LOG_PTR_ID TVar4;
  ScopeInfoEntry *pSVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  long lVar7;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  TVar3 = FileReader::ReadAddr(reader,scopeId,false);
  funcScopeInfo->ScopeId = TVar3;
  TVar4 = FileReader::ReadLogTag(reader,ctxTag,true);
  funcScopeInfo->ScriptContextLogId = TVar4;
  uVar1 = FileReader::ReadUInt32(reader,count,true);
  funcScopeInfo->ScopeCount = (uint16)uVar1;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  pSVar5 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::ScopeInfoEntry>
                     (alloc,(ulong)funcScopeInfo->ScopeCount);
  funcScopeInfo->ScopeArray = pSVar5;
  if (funcScopeInfo->ScopeCount != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      (*reader->_vptr_FileReader[6])(reader,(ulong)(lVar7 != 0));
      (*reader->_vptr_FileReader[3])(reader,0x21,0);
      iVar2 = (*reader->_vptr_FileReader[0x12])(reader,0);
      *(int *)((long)&funcScopeInfo->ScopeArray->Tag + lVar7) = iVar2;
      TVar3 = FileReader::ReadAddr(reader,subscopeId,true);
      *(TTD_PTR_ID *)((long)&funcScopeInfo->ScopeArray->IDValue + lVar7) = TVar3;
      (*reader->_vptr_FileReader[7])(reader);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < funcScopeInfo->ScopeCount);
  }
  (*reader->_vptr_FileReader[5])(reader);
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseScriptFunctionScopeInfo(ScriptFunctionScopeInfo* funcScopeInfo, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            funcScopeInfo->ScopeId = reader->ReadAddr(NSTokens::Key::scopeId);
            funcScopeInfo->ScriptContextLogId = reader->ReadLogTag(NSTokens::Key::ctxTag, true);
            funcScopeInfo->ScopeCount = (uint16)reader->ReadUInt32(NSTokens::Key::count, true);

            reader->ReadSequenceStart_WDefaultKey(true);

            funcScopeInfo->ScopeArray = alloc.SlabAllocateArray<ScopeInfoEntry>(funcScopeInfo->ScopeCount);
            for(uint32 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                reader->ReadRecordStart(i != 0);

                funcScopeInfo->ScopeArray[i].Tag = reader->ReadTag<Js::ScopeType>(NSTokens::Key::scopeType);
                funcScopeInfo->ScopeArray[i].IDValue = reader->ReadAddr(NSTokens::Key::subscopeId, true);

                reader->ReadRecordEnd();
            }

            reader->ReadSequenceEnd();

            reader->ReadRecordEnd();
        }